

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_mtrie_impl.hpp
# Opt level: O1

void __thiscall
zmq::generic_mtrie_t<zmq::pipe_t>::rm<zmq::xpub_t*>
          (generic_mtrie_t<zmq::pipe_t> *this,value_t *pipe_,
          _func_void_uchar_ptr_size_t_xpub_t_ptr *func_,xpub_t *arg_,bool call_on_uniq_)

{
  short *psVar1;
  byte bVar2;
  undefined1 uVar3;
  ushort uVar4;
  undefined2 uVar5;
  short sVar6;
  ushort uVar7;
  _List_node_base *p_Var8;
  generic_mtrie_t<zmq::pipe_t> *pgVar9;
  _List_node_base *p_Var10;
  undefined8 ******ppppppuVar11;
  undefined8 ******ppppppuVar12;
  undefined8 *****pppppuVar13;
  bool bVar14;
  byte bVar15;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  uint uVar18;
  uint uVar19;
  undefined7 in_register_00000081;
  uint uVar20;
  byte bVar21;
  pair<std::_Rb_tree_iterator<zmq::pipe_t_*>,_std::_Rb_tree_iterator<zmq::pipe_t_*>_> pVar22;
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  stack;
  uchar *local_88;
  undefined8 *****local_80;
  undefined8 *****local_78;
  long local_70;
  _List_node_base *local_68;
  _List_node_base *local_60;
  undefined4 uStack_54;
  _List_node_base *local_50;
  _func_void_uchar_ptr_size_t_xpub_t_ptr *local_48;
  xpub_t *local_40;
  value_t *local_38;
  
  local_70 = 0;
  local_80 = &local_80;
  local_78 = &local_80;
  local_38 = pipe_;
  p_Var16 = (_List_node_base *)operator_new(0x38);
  p_Var16[1]._M_next = (_List_node_base *)this;
  p_Var16[1]._M_prev = (_List_node_base *)0x0;
  p_Var16[2]._M_next = (_List_node_base *)0x0;
  *(undefined8 *)((long)&p_Var16[2]._M_next + 5) = 0;
  *(undefined8 *)((long)&p_Var16[2]._M_prev + 5) = 0;
  std::__detail::_List_node_base::_M_hook(p_Var16);
  local_70 = local_70 + 1;
  if ((undefined8 ******)local_80 == &local_80) {
    local_88 = (uchar *)0x0;
  }
  else {
    uStack_54 = (undefined4)CONCAT71(in_register_00000081,call_on_uniq_);
    local_88 = (uchar *)0x0;
    local_50 = (_List_node_base *)0x0;
    local_48 = func_;
    local_40 = arg_;
    do {
      pppppuVar13 = local_78;
      p_Var16 = (_List_node_base *)local_78[2];
      local_68 = (_List_node_base *)local_78[3];
      local_60 = (_List_node_base *)local_78[4];
      p_Var8 = (_List_node_base *)local_78[5];
      uVar4 = *(ushort *)(local_78 + 6);
      bVar15 = *(byte *)((long)local_78 + 0x32);
      bVar21 = *(byte *)((long)local_78 + 0x33);
      uVar19 = (uint)bVar21;
      uVar5 = *(undefined2 *)((long)local_78 + 0x35);
      bVar2 = *(byte *)((long)local_78 + 0x34);
      uVar3 = *(undefined1 *)((long)local_78 + 0x37);
      local_70 = local_70 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(pppppuVar13,0x38);
      uVar20 = (uint)bVar15;
      if ((bVar2 & 1) == 0) {
        p_Var17 = p_Var16->_M_next;
        if (p_Var17 != (_List_node_base *)0x0) {
          pVar22 = std::
                   _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                   ::equal_range((_Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                                  *)p_Var17,&local_38);
          p_Var10 = p_Var17[2]._M_prev;
          std::
          _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
          ::_M_erase_aux((_Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                          *)p_Var17,(_Base_ptr)pVar22.first._M_node,(_Base_ptr)pVar22.second._M_node
                        );
          if (p_Var10 != p_Var17[2]._M_prev) {
            if (((char)uStack_54 == '\0') || (p_Var16->_M_next[2]._M_prev == (_List_node_base *)0x0)
               ) {
              (*local_48)(local_88,(size_t)p_Var8,local_40);
            }
            p_Var17 = p_Var16->_M_next;
            if (p_Var17[2]._M_prev == (_List_node_base *)0x0) {
              if (p_Var17 != (_List_node_base *)0x0) {
                std::
                _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                ::~_Rb_tree((_Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                             *)p_Var17);
                operator_delete(p_Var17,0x30);
              }
              p_Var16->_M_next = (_List_node_base *)0x0;
            }
          }
        }
        if (local_50 <= p_Var8) {
          local_50 = p_Var8 + 0x10;
          local_88 = (uchar *)realloc(local_88,(size_t)local_50);
          if (local_88 == (uchar *)0x0) {
            fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                    ,0xca);
            fflush(_stderr);
            zmq_abort("FATAL ERROR: OUT OF MEMORY");
          }
        }
        sVar6 = *(short *)((long)&p_Var16->_M_prev + 2);
        if (sVar6 != 0) {
          if (sVar6 == 1) {
            local_88[(long)p_Var8] = *(uchar *)&p_Var16->_M_prev;
            p_Var17 = (_List_node_base *)operator_new(0x38);
            p_Var17[1]._M_next = p_Var16;
            p_Var17[1]._M_prev = local_68;
            p_Var17[2]._M_next = local_60;
            p_Var17[2]._M_prev = p_Var8;
            *(ushort *)&p_Var17[3]._M_next = uVar4;
            *(byte *)((long)&p_Var17[3]._M_next + 2) = bVar15;
            *(byte *)((long)&p_Var17[3]._M_next + 3) = bVar21;
            *(undefined1 *)((long)&p_Var17[3]._M_next + 4) = 1;
            *(undefined2 *)((long)&p_Var17[3]._M_next + 5) = uVar5;
            *(undefined1 *)((long)&p_Var17[3]._M_next + 7) = uVar3;
            std::__detail::_List_node_base::_M_hook(p_Var17);
            local_70 = local_70 + 1;
            p_Var16 = p_Var16[1]._M_next;
            p_Var17 = (_List_node_base *)operator_new(0x38);
            p_Var17[1]._M_next = p_Var16;
            p_Var17[1]._M_prev = (_List_node_base *)0x0;
            p_Var17[2]._M_next = (_List_node_base *)0x0;
            p_Var17[2]._M_prev = (_List_node_base *)((long)&p_Var8->_M_next + 1);
          }
          else {
            if (uVar4 == 0) {
              bVar21 = *(byte *)&p_Var16->_M_prev;
              bVar15 = ((char)sVar6 + bVar21) - 1;
            }
            local_88[(long)p_Var8] = *(char *)&p_Var16->_M_prev + (char)uVar4;
            p_Var17 = (_List_node_base *)operator_new(0x38);
            p_Var17[1]._M_next = p_Var16;
            p_Var17[1]._M_prev = local_68;
            p_Var17[2]._M_next = local_60;
            p_Var17[2]._M_prev = p_Var8;
            *(ushort *)&p_Var17[3]._M_next = uVar4;
            *(byte *)((long)&p_Var17[3]._M_next + 2) = bVar15;
            *(byte *)((long)&p_Var17[3]._M_next + 3) = bVar21;
            *(undefined1 *)((long)&p_Var17[3]._M_next + 4) = 1;
            *(undefined2 *)((long)&p_Var17[3]._M_next + 5) = uVar5;
            *(undefined1 *)((long)&p_Var17[3]._M_next + 7) = uVar3;
            std::__detail::_List_node_base::_M_hook(p_Var17);
            local_70 = local_70 + 1;
            p_Var16 = (&(p_Var16[1]._M_next)->_M_next)[uVar4];
            if (p_Var16 == (_List_node_base *)0x0) goto LAB_0018bc54;
            p_Var17 = (_List_node_base *)operator_new(0x38);
            p_Var17[1]._M_next = p_Var16;
            p_Var17[1]._M_prev = (_List_node_base *)0x0;
            p_Var17[2]._M_next = (_List_node_base *)0x0;
            p_Var17[2]._M_prev = (_List_node_base *)((long)&p_Var8->_M_next + 1);
          }
          *(undefined4 *)&p_Var17[3]._M_next = 0;
          *(undefined1 *)((long)&p_Var17[3]._M_next + 4) = 0;
LAB_0018bc44:
          std::__detail::_List_node_base::_M_hook(p_Var17);
          local_70 = local_70 + 1;
        }
      }
      else {
        sVar6 = *(short *)((long)&p_Var16->_M_prev + 2);
        if (sVar6 != 0) {
          if (sVar6 == 1) {
            bVar14 = is_redundant((generic_mtrie_t<zmq::pipe_t> *)p_Var16[1]._M_next);
            if (bVar14) {
              pgVar9 = (generic_mtrie_t<zmq::pipe_t> *)p_Var16[1]._M_next;
              if (pgVar9 != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
                ~generic_mtrie_t(pgVar9);
                operator_delete(pgVar9,0x18);
              }
              p_Var16[1]._M_next = (_List_node_base *)0x0;
              *(undefined2 *)((long)&p_Var16->_M_prev + 2) = 0;
              psVar1 = (short *)((long)&p_Var16->_M_prev + 4);
              *psVar1 = *psVar1 + -1;
              if (*psVar1 != 0) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_live_nodes == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x116);
                fflush(_stderr);
                zmq_abort("it.node->_live_nodes == 0");
              }
            }
          }
          else {
            pgVar9 = (generic_mtrie_t<zmq::pipe_t> *)(&(p_Var16[1]._M_next)->_M_next)[uVar4];
            uVar18 = uVar19;
            if (pgVar9 != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
              bVar14 = is_redundant(pgVar9);
              uVar20 = (uint)bVar15;
              if (bVar14) {
                pgVar9 = (generic_mtrie_t<zmq::pipe_t> *)(&(p_Var16[1]._M_next)->_M_next)[uVar4];
                if (pgVar9 != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
                  ~generic_mtrie_t(pgVar9);
                  operator_delete(pgVar9,0x18);
                }
                (&(p_Var16[1]._M_next)->_M_next)[uVar4] = (_List_node_base *)0x0;
                if (*(short *)((long)&p_Var16->_M_prev + 4) == 0) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_live_nodes > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                          ,0x123);
                  fflush(_stderr);
                  zmq_abort("it.node->_live_nodes > 0");
                }
                psVar1 = (short *)((long)&p_Var16->_M_prev + 4);
                *psVar1 = *psVar1 + -1;
              }
              else {
                uVar18 = (uint)*(byte *)&p_Var16->_M_prev + (uint)uVar4;
                if (uVar18 < uVar20) {
                  uVar20 = uVar18;
                }
                if (uVar18 <= uVar19) {
                  uVar18 = uVar19;
                }
              }
            }
            uVar7 = *(ushort *)((long)&p_Var16->_M_prev + 2);
            bVar21 = (byte)uVar20;
            bVar15 = (byte)uVar18;
            if ((ushort)(uVar4 + 1) < uVar7) {
              p_Var17 = (_List_node_base *)operator_new(0x38);
              p_Var17[1]._M_next = p_Var16;
              p_Var17[1]._M_prev = local_68;
              p_Var17[2]._M_next = local_60;
              p_Var17[2]._M_prev = p_Var8;
              *(ushort *)&p_Var17[3]._M_next = uVar4 + 1;
              *(byte *)((long)&p_Var17[3]._M_next + 2) = bVar21;
              *(byte *)((long)&p_Var17[3]._M_next + 3) = bVar15;
              *(undefined1 *)((long)&p_Var17[3]._M_next + 4) = 0;
              *(undefined2 *)((long)&p_Var17[3]._M_next + 5) = uVar5;
              *(undefined1 *)((long)&p_Var17[3]._M_next + 7) = uVar3;
              goto LAB_0018bc44;
            }
            if (uVar7 < 2) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_count > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x147);
              fflush(_stderr);
              zmq_abort("it.node->_count > 1");
            }
            sVar6 = *(short *)((long)&p_Var16->_M_prev + 4);
            if (sVar6 == 1) {
              if (bVar21 != bVar15) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min == it.new_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x156);
                fflush(_stderr);
                zmq_abort("it.new_min == it.new_max");
              }
              if (bVar21 < *(byte *)&p_Var16->_M_prev) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min >= it.node->_min",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x157);
                fflush(_stderr);
                zmq_abort("it.new_min >= it.node->_min");
              }
              if ((uint)*(ushort *)((long)&p_Var16->_M_prev + 2) + (uint)*(byte *)&p_Var16->_M_prev
                  <= (uVar20 & 0xff)) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_min < it.node->_min + it.node->_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x159);
                fflush(_stderr);
                zmq_abort("it.new_min < it.node->_min + it.node->_count");
              }
              p_Var8 = *(_List_node_base **)
                        ((long)p_Var16[1]._M_next +
                        ((ulong)(uVar20 & 0xff) - (ulong)*(byte *)&p_Var16->_M_prev) * 8);
              if (p_Var8 == (_List_node_base *)0x0) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","node",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x15e);
                fflush(_stderr);
                zmq_abort("node");
              }
              free(p_Var16[1]._M_next);
              p_Var16[1]._M_next = p_Var8;
              *(undefined2 *)((long)&p_Var16->_M_prev + 2) = 1;
LAB_0018c0be:
              *(byte *)&p_Var16->_M_prev = bVar21;
            }
            else if (sVar6 == 0) {
              free(p_Var16[1]._M_next);
              p_Var16[1]._M_next = (_List_node_base *)0x0;
              *(undefined2 *)((long)&p_Var16->_M_prev + 2) = 0;
            }
            else if ((*(byte *)&p_Var16->_M_prev < bVar21) ||
                    ((int)(uVar18 & 0xff) <
                     (int)((uint)*(byte *)&p_Var16->_M_prev +
                           (uint)*(ushort *)((long)&p_Var16->_M_prev + 2) + -1))) {
              if (bVar15 <= bVar21) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_max - it.new_min + 1 > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x16a);
                fflush(_stderr);
                zmq_abort("it.new_max - it.new_min + 1 > 1");
              }
              p_Var8 = p_Var16[1]._M_next;
              uVar18 = uVar18 & 0xff;
              if ((bVar21 <= *(byte *)&p_Var16->_M_prev) &&
                 ((int)((uint)*(byte *)&p_Var16->_M_prev +
                        (uint)*(ushort *)((long)&p_Var16->_M_prev + 2) + -1) <= (int)uVar18)) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_min > it.node->_min || it.new_max < it.node->_min + it.node->_count - 1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x171);
                fflush(_stderr);
                zmq_abort(
                         "it.new_min > it.node->_min || it.new_max < it.node->_min + it.node->_count - 1"
                         );
              }
              if (bVar21 < *(byte *)&p_Var16->_M_prev) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min >= it.node->_min",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x172);
                fflush(_stderr);
                zmq_abort("it.new_min >= it.node->_min");
              }
              if ((uint)*(ushort *)((long)&p_Var16->_M_prev + 2) + (uint)*(byte *)&p_Var16->_M_prev
                  <= uVar18) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_max <= it.node->_min + it.node->_count - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x175);
                fflush(_stderr);
                zmq_abort("it.new_max <= it.node->_min + it.node->_count - 1");
              }
              uVar19 = (uVar18 - (uVar20 & 0xff)) + 1;
              if ((int)(uint)*(ushort *)((long)&p_Var16->_M_prev + 2) <= (int)uVar19) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_max - it.new_min + 1 < it.node->_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x177);
                fflush(_stderr);
                zmq_abort("it.new_max - it.new_min + 1 < it.node->_count");
              }
              *(short *)((long)&p_Var16->_M_prev + 2) = (short)uVar19;
              p_Var17 = (_List_node_base *)malloc((ulong)((uVar19 & 0xffff) << 3));
              p_Var16[1]._M_next = p_Var17;
              if (p_Var17 == (_List_node_base *)0x0) {
                fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x17f);
                fflush(_stderr);
                zmq_abort("FATAL ERROR: OUT OF MEMORY");
              }
              memmove(p_Var16[1]._M_next,
                      (void *)(((ulong)(uVar20 & 0xff) - (ulong)*(byte *)&p_Var16->_M_prev) * 8 +
                              (long)p_Var8),(ulong)*(ushort *)((long)&p_Var16->_M_prev + 2) << 3);
              free(p_Var8);
              goto LAB_0018c0be;
            }
          }
        }
      }
LAB_0018bc54:
    } while ((undefined8 ******)local_80 != &local_80);
  }
  free(local_88);
  ppppppuVar12 = (undefined8 ******)local_80;
  while (ppppppuVar12 != &local_80) {
    ppppppuVar11 = (undefined8 ******)*ppppppuVar12;
    operator_delete(ppppppuVar12,0x38);
    ppppppuVar12 = ppppppuVar11;
  }
  return;
}

Assistant:

void generic_mtrie_t<T>::rm (value_t *pipe_,
                             void (*func_) (prefix_t data_,
                                            size_t size_,
                                            Arg arg_),
                             Arg arg_,
                             bool call_on_uniq_)
{
    //  This used to be implemented as a non-tail recursive travesal of the trie,
    //  which means remote clients controlled the depth of the recursion and the
    //  stack size.
    //  To simulate the non-tail recursion, with post-recursion changes depending on
    //  the result of the recursive call, a stack is used to re-visit the same node
    //  and operate on it again after children have been visisted.
    //  A boolean is used to record whether the node had already been visited and to
    //  determine if the pre- or post- children visit actions have to be taken.
    //  In the case of a node with (N > 1) children, the node has to be re-visited
    //  N times, in the correct order after each child visit.
    std::list<struct iter> stack;
    unsigned char *buff = NULL;
    size_t maxbuffsize = 0;
    struct iter it = {this, NULL, NULL, 0, 0, 0, 0, false};
    stack.push_back (it);

    while (!stack.empty ()) {
        it = stack.back ();
        stack.pop_back ();

        if (!it.processed_for_removal) {
            //  Remove the subscription from this node.
            if (it.node->_pipes && it.node->_pipes->erase (pipe_)) {
                if (!call_on_uniq_ || it.node->_pipes->empty ()) {
                    func_ (buff, it.size, arg_);
                }

                if (it.node->_pipes->empty ()) {
                    LIBZMQ_DELETE (it.node->_pipes);
                }
            }

            //  Adjust the buffer.
            if (it.size >= maxbuffsize) {
                maxbuffsize = it.size + 256;
                buff =
                  static_cast<unsigned char *> (realloc (buff, maxbuffsize));
                alloc_assert (buff);
            }

            switch (it.node->_count) {
                case 0:
                    //  If there are no subnodes in the trie, we are done with this node
                    //  pre-processing.
                    break;
                case 1: {
                    //  If there's one subnode (optimisation).

                    buff[it.size] = it.node->_min;
                    //  Mark this node as pre-processed and push it, so that the next
                    //  visit after the operation on the child can do the removals.
                    it.processed_for_removal = true;
                    stack.push_back (it);
                    struct iter next = {it.node->_next.node,
                                        NULL,
                                        NULL,
                                        ++it.size,
                                        0,
                                        0,
                                        0,
                                        false};
                    stack.push_back (next);
                    break;
                }
                default: {
                    //  If there are multiple subnodes.
                    //  When first visiting this node, initialize the new_min/max parameters
                    //  which will then be used after each child has been processed, on the
                    //  post-children iterations.
                    if (it.current_child == 0) {
                        //  New min non-null character in the node table after the removal
                        it.new_min = it.node->_min + it.node->_count - 1;
                        //  New max non-null character in the node table after the removal
                        it.new_max = it.node->_min;
                    }

                    //  Mark this node as pre-processed and push it, so that the next
                    //  visit after the operation on the child can do the removals.
                    buff[it.size] = it.node->_min + it.current_child;
                    it.processed_for_removal = true;
                    stack.push_back (it);
                    if (it.node->_next.table[it.current_child]) {
                        struct iter next = {
                          it.node->_next.table[it.current_child],
                          NULL,
                          NULL,
                          it.size + 1,
                          0,
                          0,
                          0,
                          false};
                        stack.push_back (next);
                    }
                }
            }
        } else {
            //  Reset back for the next time, in case this node doesn't get deleted.
            //  This is done unconditionally, unlike when setting this variable to true.
            it.processed_for_removal = false;

            switch (it.node->_count) {
                case 0:
                    //  If there are no subnodes in the trie, we are done with this node
                    //  post-processing.
                    break;
                case 1:
                    //  If there's one subnode (optimisation).

                    //  Prune the node if it was made redundant by the removal
                    if (it.node->_next.node->is_redundant ()) {
                        LIBZMQ_DELETE (it.node->_next.node);
                        it.node->_count = 0;
                        --it.node->_live_nodes;
                        zmq_assert (it.node->_live_nodes == 0);
                    }
                    break;
                default:
                    //  If there are multiple subnodes.
                    {
                        if (it.node->_next.table[it.current_child]) {
                            //  Prune redundant nodes from the mtrie
                            if (it.node->_next.table[it.current_child]
                                  ->is_redundant ()) {
                                LIBZMQ_DELETE (
                                  it.node->_next.table[it.current_child]);

                                zmq_assert (it.node->_live_nodes > 0);
                                --it.node->_live_nodes;
                            } else {
                                //  The node is not redundant, so it's a candidate for being
                                //  the new min/max node.
                                //
                                //  We loop through the node array from left to right, so the
                                //  first non-null, non-redundant node encountered is the new
                                //  minimum index. Conversely, the last non-redundant, non-null
                                //  node encountered is the new maximum index.
                                if (it.current_child + it.node->_min
                                    < it.new_min)
                                    it.new_min =
                                      it.current_child + it.node->_min;
                                if (it.current_child + it.node->_min
                                    > it.new_max)
                                    it.new_max =
                                      it.current_child + it.node->_min;
                            }
                        }

                        //  If there are more children to visit, push again the current
                        //  node, so that pre-processing can happen on the next child.
                        //  If we are done, reset the child index so that the ::rm is
                        //  fully idempotent.
                        ++it.current_child;
                        if (it.current_child >= it.node->_count)
                            it.current_child = 0;
                        else {
                            stack.push_back (it);
                            continue;
                        }

                        //  All children have been visited and removed if needed, and
                        //  all pre- and post-visit operations have been carried.
                        //  Resize/free the node table if needed.
                        zmq_assert (it.node->_count > 1);

                        //  Free the node table if it's no longer used.
                        switch (it.node->_live_nodes) {
                            case 0:
                                free (it.node->_next.table);
                                it.node->_next.table = NULL;
                                it.node->_count = 0;
                                break;
                            case 1:
                                //  Compact the node table if possible

                                //  If there's only one live node in the table we can
                                //  switch to using the more compact single-node
                                //  representation
                                zmq_assert (it.new_min == it.new_max);
                                zmq_assert (it.new_min >= it.node->_min);
                                zmq_assert (it.new_min
                                            < it.node->_min + it.node->_count);
                                {
                                    generic_mtrie_t *node =
                                      it.node->_next
                                        .table[it.new_min - it.node->_min];
                                    zmq_assert (node);
                                    free (it.node->_next.table);
                                    it.node->_next.node = node;
                                }
                                it.node->_count = 1;
                                it.node->_min = it.new_min;
                                break;
                            default:
                                if (it.new_min > it.node->_min
                                    || it.new_max < it.node->_min
                                                      + it.node->_count - 1) {
                                    zmq_assert (it.new_max - it.new_min + 1
                                                > 1);

                                    generic_mtrie_t **old_table =
                                      it.node->_next.table;
                                    zmq_assert (it.new_min > it.node->_min
                                                || it.new_max
                                                     < it.node->_min
                                                         + it.node->_count - 1);
                                    zmq_assert (it.new_min >= it.node->_min);
                                    zmq_assert (it.new_max
                                                <= it.node->_min
                                                     + it.node->_count - 1);
                                    zmq_assert (it.new_max - it.new_min + 1
                                                < it.node->_count);

                                    it.node->_count =
                                      it.new_max - it.new_min + 1;
                                    it.node->_next.table =
                                      static_cast<generic_mtrie_t **> (
                                        malloc (sizeof (generic_mtrie_t *)
                                                * it.node->_count));
                                    alloc_assert (it.node->_next.table);

                                    memmove (it.node->_next.table,
                                             old_table
                                               + (it.new_min - it.node->_min),
                                             sizeof (generic_mtrie_t *)
                                               * it.node->_count);
                                    free (old_table);

                                    it.node->_min = it.new_min;
                                }
                        }
                    }
            }
        }
    }

    free (buff);
}